

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

bool __thiscall Tester::runAll(Tester *this)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  string *filename;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  tables;
  Lexer lex;
  ifstream file;
  value_type local_308;
  Parser local_2e8;
  Tester *local_2c8;
  string *local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  local_298;
  Lexer local_280;
  vector<Token,_std::allocator<Token>_> local_250;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running all tests...\n",0x15);
  filename = (this->testList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_2c0 = (this->testList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (filename != local_2c0) {
    local_2c8 = this;
    do {
      std::ifstream::ifstream((istream *)local_238,(string *)filename,_S_in);
      if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Test error: could not find file ",0x20);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                            filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::ifstream::~ifstream(local_238);
        return false;
      }
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      local_308._M_string_length = 0;
      local_308.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_308,cVar1);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2b8,&local_308);
      }
      Lexer::Lexer(&local_280);
      Lexer::scan(&local_280,filename,false,false);
      local_2e8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8.root._M_t.super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>.
      _M_t.super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
      super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl =
           (__uniq_ptr_data<SequenceNode,_std::default_delete<SequenceNode>,_true,_true>)
           (__uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>)0x0;
      local_2e8.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<Token,_std::allocator<Token>_>::vector(&local_250,&local_280.tokens);
      Parser::parse(&local_2e8,&local_250);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_250);
      local_298.
      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.
      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.
      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*((ASTNode *)
        local_2e8.root._M_t.super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>.
        _M_t.super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
        super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl)->_vptr_ASTNode[5])
                (local_2e8.root._M_t.
                 super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
                 super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
                 super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl,&local_298);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
      ::~vector(&local_298);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_2e8.tokens);
      if (local_2e8.root._M_t.
          super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
          super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
          super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>)0x0) {
        (*((ASTNode *)
          local_2e8.root._M_t.
          super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
          super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
          super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl)->_vptr_ASTNode[1])();
      }
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_280.tokens);
      std::
      vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~vector(&local_280.rules);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,
                        CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                 local_308.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b8);
      std::ifstream::~ifstream((istream *)local_238);
      filename = filename + 1;
    } while (filename != local_2c0);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests OK.\n",0xb);
  return true;
}

Assistant:

bool Tester::runAll() {
    std::cout << "Running all tests...\n";

    for (auto const& filename : testList) {
        std::ifstream file(filename);
        if (!file.good()) {
            std::cout << "Test error: could not find file " << filename << "\n";
            return false;
        }
        std::vector<std::string> test;

        std::string line;
        while (std::getline(file, line)) {
            test.push_back(line);
        }

        try {
            Lexer lex;
            lex.scan(filename, false, false);
            Parser par;
            par.parse(lex.tokens);

            std::vector<SymbolTable> tables;
            par.root->check(tables);
        } catch (SyntacticException& e) {
            std::cout << "Parsing test '" << filename << "' failed: " << e.what() << std::endl;
            return false;
        } catch (SemanticException& e) {
            std::cout << "Semantic test '" << filename << "' failed: " << e.what() << std::endl;
            return false;
        } catch (std::exception& e) {
            std::cout << "Tests failed: " << e.what() << std::endl;
            return false;
        }
    }

    std::cout << testList.size() << "/" << testList.size() << " tests OK.\n";
    return true;
}